

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

int png_inflate_claim(png_structrp png_ptr,png_uint_32 owner)

{
  int32_t local_60;
  int local_5c;
  int window_bits;
  int ret;
  char msg [64];
  png_uint_32 owner_local;
  png_structrp png_ptr_local;
  
  msg._60_4_ = owner;
  if (png_ptr->zowner != 0) {
    window_bits._0_1_ = (undefined1)(png_ptr->zowner >> 0x18);
    window_bits._1_1_ = (undefined1)(png_ptr->zowner >> 0x10);
    window_bits._2_1_ = (undefined1)(png_ptr->zowner >> 8);
    window_bits._3_1_ = (undefined1)png_ptr->zowner;
    png_safecat((png_charp)&window_bits,0x40,4," using zstream");
    png_chunk_warning(png_ptr,(png_const_charp)&window_bits);
    png_ptr->zowner = 0;
  }
  local_60 = 0;
  if ((png_ptr->options >> 2 & 3) == 3) {
    local_60 = 0xf;
    png_ptr->zstream_start = '\0';
  }
  else {
    png_ptr->zstream_start = '\x01';
  }
  (png_ptr->zstream).next_in = (uchar *)0x0;
  (png_ptr->zstream).avail_in = 0;
  (png_ptr->zstream).next_out = (uchar *)0x0;
  (png_ptr->zstream).avail_out = 0;
  if ((png_ptr->flags & 2) == 0) {
    local_5c = inflateInit2_(&png_ptr->zstream,local_60,"1.3.1.zlib-ng",0x70);
    if (local_5c == 0) {
      png_ptr->flags = png_ptr->flags | 2;
    }
  }
  else {
    local_5c = inflateReset2(&png_ptr->zstream,local_60);
  }
  if (local_5c == 0) {
    png_ptr->zowner = msg._60_4_;
  }
  else {
    png_zstream_error(png_ptr,local_5c);
  }
  return local_5c;
}

Assistant:

static int
png_inflate_claim(png_structrp png_ptr, png_uint_32 owner)
{
   if (png_ptr->zowner != 0)
   {
      char msg[64];

      PNG_STRING_FROM_CHUNK(msg, png_ptr->zowner);
      /* So the message that results is "<chunk> using zstream"; this is an
       * internal error, but is very useful for debugging.  i18n requirements
       * are minimal.
       */
      (void)png_safecat(msg, (sizeof msg), 4, " using zstream");
#if PNG_RELEASE_BUILD
      png_chunk_warning(png_ptr, msg);
      png_ptr->zowner = 0;
#else
      png_chunk_error(png_ptr, msg);
#endif
   }

   /* Implementation note: unlike 'png_deflate_claim' this internal function
    * does not take the size of the data as an argument.  Some efficiency could
    * be gained by using this when it is known *if* the zlib stream itself does
    * not record the number; however, this is an illusion: the original writer
    * of the PNG may have selected a lower window size, and we really must
    * follow that because, for systems with with limited capabilities, we
    * would otherwise reject the application's attempts to use a smaller window
    * size (zlib doesn't have an interface to say "this or lower"!).
    *
    * inflateReset2 was added to zlib 1.2.4; before this the window could not be
    * reset, therefore it is necessary to always allocate the maximum window
    * size with earlier zlibs just in case later compressed chunks need it.
    */
   {
      int ret; /* zlib return code */
#if ZLIB_VERNUM >= 0x1240
      int window_bits = 0;

# if defined(PNG_SET_OPTION_SUPPORTED) && defined(PNG_MAXIMUM_INFLATE_WINDOW)
      if (((png_ptr->options >> PNG_MAXIMUM_INFLATE_WINDOW) & 3) ==
          PNG_OPTION_ON)
      {
         window_bits = 15;
         png_ptr->zstream_start = 0; /* fixed window size */
      }

      else
      {
         png_ptr->zstream_start = 1;
      }
# endif

#endif /* ZLIB_VERNUM >= 0x1240 */

      /* Set this for safety, just in case the previous owner left pointers to
       * memory allocations.
       */
      png_ptr->zstream.next_in = NULL;
      png_ptr->zstream.avail_in = 0;
      png_ptr->zstream.next_out = NULL;
      png_ptr->zstream.avail_out = 0;

      if ((png_ptr->flags & PNG_FLAG_ZSTREAM_INITIALIZED) != 0)
      {
#if ZLIB_VERNUM >= 0x1240
         ret = inflateReset2(&png_ptr->zstream, window_bits);
#else
         ret = inflateReset(&png_ptr->zstream);
#endif
      }

      else
      {
#if ZLIB_VERNUM >= 0x1240
         ret = inflateInit2(&png_ptr->zstream, window_bits);
#else
         ret = inflateInit(&png_ptr->zstream);
#endif

         if (ret == Z_OK)
            png_ptr->flags |= PNG_FLAG_ZSTREAM_INITIALIZED;
      }

#ifdef PNG_DISABLE_ADLER32_CHECK_SUPPORTED
      if (((png_ptr->options >> PNG_IGNORE_ADLER32) & 3) == PNG_OPTION_ON)
         /* Turn off validation of the ADLER32 checksum in IDAT chunks */
         ret = inflateValidate(&png_ptr->zstream, 0);
#endif

      if (ret == Z_OK)
         png_ptr->zowner = owner;

      else
         png_zstream_error(png_ptr, ret);

      return ret;
   }

#ifdef window_bits
# undef window_bits
#endif
}